

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  RTCRayQueryContext *pRVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 (*pauVar16) [16];
  byte bVar17;
  int iVar18;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong unaff_R12;
  size_t mask;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar65;
  float fVar66;
  vint4 bi;
  undefined1 auVar63 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar64 [64];
  undefined1 auVar71 [16];
  vint4 ai_1;
  undefined1 auVar72 [16];
  undefined4 uVar73;
  vint4 ai;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_127c;
  RTCIntersectArguments *local_1278;
  ulong local_1270;
  Geometry *local_1268;
  ulong local_1260;
  ulong local_1258;
  ulong local_1250;
  ulong local_1248;
  undefined1 (*local_1240) [16];
  Scene *local_1238;
  RTCFilterFunctionNArguments local_1230;
  float local_1200;
  undefined4 local_11fc;
  undefined4 local_11f8;
  float local_11f4;
  undefined4 local_11f0;
  undefined4 local_11ec;
  uint local_11e8;
  uint local_11e4;
  uint local_11e0;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  byte local_10df;
  float local_10c0 [4];
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  int iStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  int iVar19;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      local_1240 = (undefined1 (*) [16])local_f90;
      auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar33 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      auVar30 = vandps_avx512vl((undefined1  [16])aVar2,auVar30);
      auVar76._8_4_ = 0x219392ef;
      auVar76._0_8_ = 0x219392ef219392ef;
      auVar76._12_4_ = 0x219392ef;
      uVar23 = vcmpps_avx512vl(auVar30,auVar76,1);
      bVar4 = (bool)((byte)uVar23 & 1);
      auVar32._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
      bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
      bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
      auVar30 = vrcp14ps_avx512vl(auVar32);
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = &DAT_3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar31 = vfnmadd213ps_avx512vl(auVar32,auVar30,auVar31);
      auVar71 = vfmadd132ps_fma(auVar31,auVar30,auVar30);
      auVar30 = vbroadcastss_avx512vl(auVar71);
      auVar86 = ZEXT1664(auVar30);
      auVar30 = vmovshdup_avx(auVar71);
      auVar31 = vshufps_avx512vl(auVar71,auVar71,0x55);
      auVar87 = ZEXT1664(auVar31);
      auVar31 = vshufpd_avx(auVar71,auVar71,1);
      auVar32 = vshufps_avx512vl(auVar71,auVar71,0xaa);
      auVar88 = ZEXT1664(auVar32);
      auVar63._0_4_ = auVar71._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar63._4_4_ = auVar71._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar63._8_4_ = auVar71._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar63._12_4_ = auVar71._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      auVar78._4_4_ = auVar63._0_4_;
      auVar78._0_4_ = auVar63._0_4_;
      auVar78._8_4_ = auVar63._0_4_;
      auVar78._12_4_ = auVar63._0_4_;
      auVar32 = vshufps_avx(auVar63,auVar63,0x55);
      auVar63 = vshufps_avx(auVar63,auVar63,0xaa);
      local_1248 = (ulong)(auVar71._0_4_ < 0.0) << 4;
      local_1250 = (ulong)(auVar30._0_4_ < 0.0) << 4 | 0x20;
      local_1258 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x40;
      uVar23 = local_1248 ^ 0x10;
      uVar24 = local_1250 ^ 0x10;
      uVar29 = local_1258 ^ 0x10;
      uVar73 = auVar33._0_4_;
      auVar64 = ZEXT1664(CONCAT412(uVar73,CONCAT48(uVar73,CONCAT44(uVar73,uVar73))));
      auVar71._8_4_ = 0x80000000;
      auVar71._0_8_ = 0x8000000080000000;
      auVar71._12_4_ = 0x80000000;
      auVar33 = vxorps_avx512vl(auVar78,auVar71);
      auVar89 = ZEXT1664(auVar33);
      auVar33 = vxorps_avx512vl(auVar32,auVar71);
      auVar90 = ZEXT1664(auVar33);
      auVar33 = vxorps_avx512vl(auVar63,auVar71);
      auVar91 = ZEXT1664(auVar33);
      auVar34 = vbroadcastss_avx512vl(auVar34);
      auVar92 = ZEXT1664(auVar34);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar93 = ZEXT3264(auVar49);
      auVar49 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
      auVar94 = ZEXT3264(auVar49);
      auVar34 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar95 = ZEXT1664(auVar34);
      auVar96 = ZEXT3264(_DAT_02060940);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar97 = ZEXT3264(auVar49);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar98 = ZEXT3264(auVar49);
      do {
        do {
          do {
            if (local_1240 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar16 = local_1240 + -1;
            local_1240 = local_1240 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar16 + 8));
          uVar28 = *(ulong *)*local_1240;
          do {
            if ((uVar28 & 8) == 0) {
              auVar34 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(uVar28 + 0x20 + local_1248),auVar89._0_16_
                                   ,auVar86._0_16_);
              auVar33 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(uVar28 + 0x20 + local_1250),auVar90._0_16_
                                   ,auVar87._0_16_);
              auVar34 = vpmaxsd_avx(auVar34,auVar33);
              auVar33 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(uVar28 + 0x20 + local_1258),auVar91._0_16_
                                   ,auVar88._0_16_);
              auVar33 = vpmaxsd_avx512vl(auVar33,auVar92._0_16_);
              auVar34 = vpmaxsd_avx(auVar34,auVar33);
              auVar33 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar23),auVar89._0_16_,
                                   auVar86._0_16_);
              auVar30 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar24),auVar90._0_16_,
                                   auVar87._0_16_);
              auVar33 = vpminsd_avx(auVar33,auVar30);
              auVar30 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar29),auVar91._0_16_,
                                   auVar88._0_16_);
              auVar30 = vpminsd_avx(auVar30,auVar64._0_16_);
              auVar33 = vpminsd_avx(auVar33,auVar30);
              uVar9 = vpcmpd_avx512vl(auVar34,auVar33,2);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)((byte)uVar9 & 0xf));
              local_1160._0_16_ = auVar34;
            }
            if ((uVar28 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar18 = 4;
              }
              else {
                uVar27 = uVar28 & 0xfffffffffffffff0;
                lVar25 = 0;
                for (uVar28 = unaff_R12; (uVar28 & 1) == 0;
                    uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                  lVar25 = lVar25 + 1;
                }
                iVar18 = 0;
                iVar19 = 0;
                uVar26 = unaff_R12 - 1 & unaff_R12;
                uVar28 = *(ulong *)(uVar27 + lVar25 * 8);
                if (uVar26 != 0) {
                  uVar22 = *(uint *)(local_1160 + lVar25 * 4);
                  lVar25 = 0;
                  for (uVar21 = uVar26; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                      ) {
                    lVar25 = lVar25 + 1;
                  }
                  uVar26 = uVar26 - 1 & uVar26;
                  uVar21 = *(ulong *)(uVar27 + lVar25 * 8);
                  uVar10 = *(uint *)(local_1160 + lVar25 * 4);
                  iVar18 = iVar19;
                  if (uVar26 == 0) {
                    if (uVar22 < uVar10) {
                      *(ulong *)*local_1240 = uVar21;
                      *(uint *)((long)*local_1240 + 8) = uVar10;
                      local_1240 = local_1240 + 1;
                    }
                    else {
                      *(ulong *)*local_1240 = uVar28;
                      *(uint *)((long)*local_1240 + 8) = uVar22;
                      local_1240 = local_1240 + 1;
                      uVar28 = uVar21;
                    }
                  }
                  else {
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = uVar28;
                    auVar34 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar22));
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = uVar21;
                    auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar10));
                    lVar25 = 0;
                    for (uVar28 = uVar26; (uVar28 & 1) == 0;
                        uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                      lVar25 = lVar25 + 1;
                    }
                    uVar26 = uVar26 - 1 & uVar26;
                    auVar72._8_8_ = 0;
                    auVar72._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
                    auVar63 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_1160 + lVar25 * 4)));
                    auVar30 = vpshufd_avx(auVar34,0xaa);
                    auVar31 = vpshufd_avx(auVar33,0xaa);
                    auVar32 = vpshufd_avx(auVar63,0xaa);
                    if (uVar26 == 0) {
                      uVar28 = vpcmpgtd_avx512vl(auVar31,auVar30);
                      uVar28 = uVar28 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar33,auVar34);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar35._0_4_ = (uint)bVar4 * auVar31._0_4_ | (uint)!bVar4 * auVar30._0_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar35._4_4_ = (uint)bVar4 * auVar31._4_4_ | (uint)!bVar4 * auVar30._4_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar35._8_4_ = (uint)bVar4 * auVar31._8_4_ | (uint)!bVar4 * auVar30._8_4_;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar35._12_4_ = (uint)bVar4 * auVar31._12_4_ | (uint)!bVar4 * auVar30._12_4_;
                      auVar33 = vmovdqa32_avx512vl(auVar33);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar36._0_4_ = (uint)bVar4 * auVar33._0_4_ | (uint)!bVar4 * auVar34._0_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar36._4_4_ = (uint)bVar4 * auVar33._4_4_ | (uint)!bVar4 * auVar34._4_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar36._8_4_ = (uint)bVar4 * auVar33._8_4_ | (uint)!bVar4 * auVar34._8_4_;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar36._12_4_ = (uint)bVar4 * auVar33._12_4_ | (uint)!bVar4 * auVar34._12_4_;
                      auVar34 = vpshufd_avx(auVar35,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar32,auVar34);
                      uVar27 = uVar27 & 0xf;
                      auVar33 = vpblendmd_avx512vl(auVar63,auVar35);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      bVar5 = (bool)((byte)(uVar27 >> 1) & 1);
                      uVar28 = CONCAT44((uint)bVar5 * auVar33._4_4_ | (uint)!bVar5 * auVar34._4_4_,
                                        (uint)bVar4 * auVar33._0_4_ | (uint)!bVar4 * auVar34._0_4_);
                      auVar34 = vmovdqa32_avx512vl(auVar63);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      auVar37._0_4_ = (uint)bVar4 * auVar34._0_4_ | !bVar4 * auVar35._0_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar37._4_4_ = (uint)bVar4 * auVar34._4_4_ | !bVar4 * auVar35._4_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar37._8_4_ = (uint)bVar4 * auVar34._8_4_ | !bVar4 * auVar35._8_4_;
                      bVar4 = SUB81(uVar27 >> 3,0);
                      auVar37._12_4_ = (uint)bVar4 * auVar34._12_4_ | !bVar4 * auVar35._12_4_;
                      auVar34 = vpshufd_avx(auVar37,0xaa);
                      auVar33 = vpshufd_avx(auVar36,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar34,auVar33);
                      uVar27 = uVar27 & 0xf;
                      auVar33 = vpblendmd_avx512vl(auVar37,auVar36);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      auVar38._0_4_ = (uint)bVar4 * auVar33._0_4_ | (uint)!bVar4 * auVar34._0_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar38._4_4_ = (uint)bVar4 * auVar33._4_4_ | (uint)!bVar4 * auVar34._4_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar38._8_4_ = (uint)bVar4 * auVar33._8_4_ | (uint)!bVar4 * auVar34._8_4_;
                      bVar4 = SUB81(uVar27 >> 3,0);
                      auVar38._12_4_ = (uint)bVar4 * auVar33._12_4_ | (uint)!bVar4 * auVar34._12_4_;
                      auVar34 = vmovdqa32_avx512vl(auVar37);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      auVar39._0_4_ = (uint)bVar4 * auVar34._0_4_ | !bVar4 * auVar36._0_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar39._4_4_ = (uint)bVar4 * auVar34._4_4_ | !bVar4 * auVar36._4_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar39._8_4_ = (uint)bVar4 * auVar34._8_4_ | !bVar4 * auVar36._8_4_;
                      bVar4 = SUB81(uVar27 >> 3,0);
                      auVar39._12_4_ = (uint)bVar4 * auVar34._12_4_ | !bVar4 * auVar36._12_4_;
                      *local_1240 = auVar39;
                      local_1240[1] = auVar38;
                      local_1240 = local_1240 + 2;
                    }
                    else {
                      lVar25 = 0;
                      for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      uVar22 = *(uint *)(local_1160 + lVar25 * 4);
                      auVar80._8_8_ = 0;
                      auVar80._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
                      auVar71 = vpunpcklqdq_avx(auVar80,ZEXT416(uVar22));
                      uVar28 = vpcmpgtd_avx512vl(auVar31,auVar30);
                      uVar28 = uVar28 & 0xf;
                      auVar31 = vpblendmd_avx512vl(auVar33,auVar34);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar40._0_4_ = (uint)bVar4 * auVar31._0_4_ | (uint)!bVar4 * auVar30._0_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar40._4_4_ = (uint)bVar4 * auVar31._4_4_ | (uint)!bVar4 * auVar30._4_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar40._8_4_ = (uint)bVar4 * auVar31._8_4_ | (uint)!bVar4 * auVar30._8_4_;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar40._12_4_ = (uint)bVar4 * auVar31._12_4_ | (uint)!bVar4 * auVar30._12_4_;
                      auVar33 = vmovdqa32_avx512vl(auVar33);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar41._0_4_ = (uint)bVar4 * auVar33._0_4_ | (uint)!bVar4 * auVar34._0_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar41._4_4_ = (uint)bVar4 * auVar33._4_4_ | (uint)!bVar4 * auVar34._4_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar41._8_4_ = (uint)bVar4 * auVar33._8_4_ | (uint)!bVar4 * auVar34._8_4_;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar41._12_4_ = (uint)bVar4 * auVar33._12_4_ | (uint)!bVar4 * auVar34._12_4_;
                      auVar74._4_4_ = uVar22;
                      auVar74._0_4_ = uVar22;
                      auVar74._8_4_ = uVar22;
                      auVar74._12_4_ = uVar22;
                      uVar28 = vpcmpgtd_avx512vl(auVar74,auVar32);
                      uVar28 = uVar28 & 0xf;
                      auVar34 = vpblendmd_avx512vl(auVar71,auVar63);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar42._0_4_ = (uint)bVar4 * auVar34._0_4_ | !bVar4 * uVar22;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar42._4_4_ = (uint)bVar4 * auVar34._4_4_ | !bVar4 * uVar22;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar42._8_4_ = (uint)bVar4 * auVar34._8_4_ | !bVar4 * uVar22;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar42._12_4_ = (uint)bVar4 * auVar34._12_4_ | !bVar4 * uVar22;
                      auVar34 = vmovdqa32_avx512vl(auVar71);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar43._0_4_ = (uint)bVar4 * auVar34._0_4_ | (uint)!bVar4 * auVar63._0_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar43._4_4_ = (uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * auVar63._4_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar43._8_4_ = (uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * auVar63._8_4_;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar43._12_4_ = (uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * auVar63._12_4_;
                      auVar34 = vpshufd_avx(auVar43,0xaa);
                      auVar33 = vpshufd_avx(auVar41,0xaa);
                      uVar28 = vpcmpgtd_avx512vl(auVar34,auVar33);
                      uVar28 = uVar28 & 0xf;
                      auVar33 = vpblendmd_avx512vl(auVar43,auVar41);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar44._0_4_ = (uint)bVar4 * auVar33._0_4_ | (uint)!bVar4 * auVar34._0_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar44._4_4_ = (uint)bVar4 * auVar33._4_4_ | (uint)!bVar4 * auVar34._4_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar44._8_4_ = (uint)bVar4 * auVar33._8_4_ | (uint)!bVar4 * auVar34._8_4_;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar44._12_4_ = (uint)bVar4 * auVar33._12_4_ | (uint)!bVar4 * auVar34._12_4_;
                      auVar34 = vmovdqa32_avx512vl(auVar43);
                      bVar4 = (bool)((byte)uVar28 & 1);
                      auVar45._0_4_ = (uint)bVar4 * auVar34._0_4_ | !bVar4 * auVar41._0_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 1) & 1);
                      auVar45._4_4_ = (uint)bVar4 * auVar34._4_4_ | !bVar4 * auVar41._4_4_;
                      bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                      auVar45._8_4_ = (uint)bVar4 * auVar34._8_4_ | !bVar4 * auVar41._8_4_;
                      bVar4 = SUB81(uVar28 >> 3,0);
                      auVar45._12_4_ = (uint)bVar4 * auVar34._12_4_ | !bVar4 * auVar41._12_4_;
                      auVar34 = vpshufd_avx(auVar42,0xaa);
                      auVar33 = vpshufd_avx(auVar40,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar34,auVar33);
                      uVar27 = uVar27 & 0xf;
                      auVar33 = vpblendmd_avx512vl(auVar42,auVar40);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      bVar5 = (bool)((byte)(uVar27 >> 1) & 1);
                      uVar28 = CONCAT44((uint)bVar5 * auVar33._4_4_ | (uint)!bVar5 * auVar34._4_4_,
                                        (uint)bVar4 * auVar33._0_4_ | (uint)!bVar4 * auVar34._0_4_);
                      auVar34 = vmovdqa32_avx512vl(auVar42);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      auVar46._0_4_ = (uint)bVar4 * auVar34._0_4_ | !bVar4 * auVar40._0_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar46._4_4_ = (uint)bVar4 * auVar34._4_4_ | !bVar4 * auVar40._4_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar46._8_4_ = (uint)bVar4 * auVar34._8_4_ | !bVar4 * auVar40._8_4_;
                      bVar4 = SUB81(uVar27 >> 3,0);
                      auVar46._12_4_ = (uint)bVar4 * auVar34._12_4_ | !bVar4 * auVar40._12_4_;
                      auVar34 = vpshufd_avx(auVar46,0xaa);
                      auVar33 = vpshufd_avx(auVar44,0xaa);
                      uVar27 = vpcmpgtd_avx512vl(auVar33,auVar34);
                      uVar27 = uVar27 & 0xf;
                      auVar33 = vpblendmd_avx512vl(auVar44,auVar46);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      auVar47._0_4_ = (uint)bVar4 * auVar33._0_4_ | (uint)!bVar4 * auVar34._0_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar47._4_4_ = (uint)bVar4 * auVar33._4_4_ | (uint)!bVar4 * auVar34._4_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar47._8_4_ = (uint)bVar4 * auVar33._8_4_ | (uint)!bVar4 * auVar34._8_4_;
                      bVar4 = SUB81(uVar27 >> 3,0);
                      auVar47._12_4_ = (uint)bVar4 * auVar33._12_4_ | (uint)!bVar4 * auVar34._12_4_;
                      auVar34 = vmovdqa32_avx512vl(auVar44);
                      bVar4 = (bool)((byte)uVar27 & 1);
                      auVar48._0_4_ = (uint)bVar4 * auVar34._0_4_ | !bVar4 * auVar46._0_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 1) & 1);
                      auVar48._4_4_ = (uint)bVar4 * auVar34._4_4_ | !bVar4 * auVar46._4_4_;
                      bVar4 = (bool)((byte)(uVar27 >> 2) & 1);
                      auVar48._8_4_ = (uint)bVar4 * auVar34._8_4_ | !bVar4 * auVar46._8_4_;
                      bVar4 = SUB81(uVar27 >> 3,0);
                      auVar48._12_4_ = (uint)bVar4 * auVar34._12_4_ | !bVar4 * auVar46._12_4_;
                      *local_1240 = auVar45;
                      local_1240[1] = auVar48;
                      local_1240[2] = auVar47;
                      local_1240 = local_1240 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar18 = 6;
            }
          } while (iVar18 == 0);
        } while (iVar18 != 6);
        uVar27 = (ulong)((uint)uVar28 & 0xf);
        if (uVar27 != 8) {
          uVar28 = uVar28 & 0xfffffffffffffff0;
          lVar25 = 0;
          do {
            lVar20 = lVar25 * 0xe0;
            lVar1 = uVar28 + 0xd0 + lVar20;
            local_1000 = *(undefined8 *)(lVar1 + 0x10);
            uStack_ff8 = *(undefined8 *)(lVar1 + 0x18);
            lVar1 = uVar28 + 0xc0 + lVar20;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            uStack_ff0 = local_1000;
            uStack_fe8 = uStack_ff8;
            auVar75._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x60 + lVar20);
            auVar75._0_16_ = *(undefined1 (*) [16])(uVar28 + lVar20);
            auVar77._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x70 + lVar20);
            auVar77._0_16_ = *(undefined1 (*) [16])(uVar28 + 0x10 + lVar20);
            auVar79._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x80 + lVar20);
            auVar79._0_16_ = *(undefined1 (*) [16])(uVar28 + 0x20 + lVar20);
            auVar34 = *(undefined1 (*) [16])(uVar28 + 0x30 + lVar20);
            auVar49._16_16_ = auVar34;
            auVar49._0_16_ = auVar34;
            auVar33 = *(undefined1 (*) [16])(uVar28 + 0x40 + lVar20);
            auVar60._16_16_ = auVar33;
            auVar60._0_16_ = auVar33;
            auVar30 = *(undefined1 (*) [16])(uVar28 + 0x50 + lVar20);
            auVar59._16_16_ = auVar30;
            auVar59._0_16_ = auVar30;
            auVar31 = *(undefined1 (*) [16])(uVar28 + 0x90 + lVar20);
            auVar58._16_16_ = auVar31;
            auVar58._0_16_ = auVar31;
            auVar31 = *(undefined1 (*) [16])(uVar28 + 0xa0 + lVar20);
            auVar57._16_16_ = auVar31;
            auVar57._0_16_ = auVar31;
            auVar31 = *(undefined1 (*) [16])(uVar28 + 0xb0 + lVar20);
            auVar56._16_16_ = auVar31;
            auVar56._0_16_ = auVar31;
            auVar49 = vsubps_avx(auVar75,auVar49);
            auVar60 = vsubps_avx(auVar77,auVar60);
            auVar59 = vsubps_avx(auVar79,auVar59);
            auVar58 = vsubps_avx(auVar58,auVar75);
            auVar57 = vsubps_avx(auVar57,auVar77);
            auVar56 = vsubps_avx(auVar56,auVar79);
            auVar53._4_4_ = auVar60._4_4_ * auVar56._4_4_;
            auVar53._0_4_ = auVar60._0_4_ * auVar56._0_4_;
            auVar53._8_4_ = auVar60._8_4_ * auVar56._8_4_;
            auVar53._12_4_ = auVar60._12_4_ * auVar56._12_4_;
            auVar53._16_4_ = auVar60._16_4_ * auVar56._16_4_;
            auVar53._20_4_ = auVar60._20_4_ * auVar56._20_4_;
            auVar53._24_4_ = auVar60._24_4_ * auVar56._24_4_;
            auVar53._28_4_ = auVar34._12_4_;
            auVar31 = vfmsub231ps_fma(auVar53,auVar57,auVar59);
            auVar54._4_4_ = auVar59._4_4_ * auVar58._4_4_;
            auVar54._0_4_ = auVar59._0_4_ * auVar58._0_4_;
            auVar54._8_4_ = auVar59._8_4_ * auVar58._8_4_;
            auVar54._12_4_ = auVar59._12_4_ * auVar58._12_4_;
            auVar54._16_4_ = auVar59._16_4_ * auVar58._16_4_;
            auVar54._20_4_ = auVar59._20_4_ * auVar58._20_4_;
            auVar54._24_4_ = auVar59._24_4_ * auVar58._24_4_;
            auVar54._28_4_ = auVar33._12_4_;
            auVar33 = vfmsub231ps_fma(auVar54,auVar56,auVar49);
            auVar55._4_4_ = auVar49._4_4_ * auVar57._4_4_;
            auVar55._0_4_ = auVar49._0_4_ * auVar57._0_4_;
            auVar55._8_4_ = auVar49._8_4_ * auVar57._8_4_;
            auVar55._12_4_ = auVar49._12_4_ * auVar57._12_4_;
            auVar55._16_4_ = auVar49._16_4_ * auVar57._16_4_;
            auVar55._20_4_ = auVar49._20_4_ * auVar57._20_4_;
            auVar55._24_4_ = auVar49._24_4_ * auVar57._24_4_;
            auVar55._28_4_ = auVar30._12_4_;
            uVar73 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar83._4_4_ = uVar73;
            auVar83._0_4_ = uVar73;
            auVar83._8_4_ = uVar73;
            auVar83._12_4_ = uVar73;
            auVar83._16_4_ = uVar73;
            auVar83._20_4_ = uVar73;
            auVar83._24_4_ = uVar73;
            auVar83._28_4_ = uVar73;
            uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar84._4_4_ = uVar73;
            auVar84._0_4_ = uVar73;
            auVar84._8_4_ = uVar73;
            auVar84._12_4_ = uVar73;
            auVar84._16_4_ = uVar73;
            auVar84._20_4_ = uVar73;
            auVar84._24_4_ = uVar73;
            auVar84._28_4_ = uVar73;
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar85._4_4_ = fVar68;
            auVar85._0_4_ = fVar68;
            auVar85._8_4_ = fVar68;
            auVar85._12_4_ = fVar68;
            auVar85._16_4_ = fVar68;
            auVar85._20_4_ = fVar68;
            auVar85._24_4_ = fVar68;
            auVar85._28_4_ = fVar68;
            uVar73 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar50._4_4_ = uVar73;
            auVar50._0_4_ = uVar73;
            auVar50._8_4_ = uVar73;
            auVar50._12_4_ = uVar73;
            auVar50._16_4_ = uVar73;
            auVar50._20_4_ = uVar73;
            auVar50._24_4_ = uVar73;
            auVar50._28_4_ = uVar73;
            auVar50 = vsubps_avx512vl(auVar75,auVar50);
            auVar30 = vfmsub231ps_fma(auVar55,auVar58,auVar60);
            uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar51._4_4_ = uVar73;
            auVar51._0_4_ = uVar73;
            auVar51._8_4_ = uVar73;
            auVar51._12_4_ = uVar73;
            auVar51._16_4_ = uVar73;
            auVar51._20_4_ = uVar73;
            auVar51._24_4_ = uVar73;
            auVar51._28_4_ = uVar73;
            auVar51 = vsubps_avx512vl(auVar77,auVar51);
            uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar52._4_4_ = uVar73;
            auVar52._0_4_ = uVar73;
            auVar52._8_4_ = uVar73;
            auVar52._12_4_ = uVar73;
            auVar52._16_4_ = uVar73;
            auVar52._20_4_ = uVar73;
            auVar52._24_4_ = uVar73;
            auVar52._28_4_ = uVar73;
            auVar52 = vsubps_avx512vl(auVar79,auVar52);
            auVar53 = vmulps_avx512vl(auVar84,auVar52);
            auVar53 = vfmsub231ps_avx512vl(auVar53,auVar51,auVar85);
            auVar54 = vmulps_avx512vl(auVar85,auVar50);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar52,auVar83);
            auVar55 = vmulps_avx512vl(auVar83,auVar51);
            local_1100 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar84);
            auVar14._4_4_ = fVar68 * auVar30._4_4_;
            auVar14._0_4_ = fVar68 * auVar30._0_4_;
            auVar14._8_4_ = fVar68 * auVar30._8_4_;
            auVar14._12_4_ = fVar68 * auVar30._12_4_;
            auVar14._16_4_ = fVar68 * 0.0;
            auVar14._20_4_ = fVar68 * 0.0;
            auVar14._24_4_ = fVar68 * 0.0;
            auVar14._28_4_ = fVar68;
            auVar34 = vfmadd231ps_fma(auVar14,ZEXT1632(auVar33),auVar84);
            auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),ZEXT1632(auVar31),auVar83);
            vandps_avx512vl(ZEXT1632(auVar34),auVar93._0_32_);
            auVar56 = vmulps_avx512vl(auVar56,local_1100);
            auVar57 = vfmadd231ps_avx512vl(auVar56,auVar54,auVar57);
            auVar58 = vfmadd231ps_avx512vl(auVar57,auVar53,auVar58);
            vandps_avx512vl(ZEXT1632(auVar34),auVar94._0_32_);
            fVar68 = auVar58._16_4_;
            fVar69 = auVar58._20_4_;
            fVar70 = auVar58._24_4_;
            auVar57 = ZEXT1232(ZEXT812(0));
            auVar59 = vmulps_avx512vl(auVar59,local_1100);
            auVar60 = vfmadd231ps_avx512vl(auVar59,auVar60,auVar54);
            auVar49 = vfmadd231ps_avx512vl(auVar60,auVar49,auVar53);
            auVar81._0_4_ = (float)(auVar58._0_4_ ^ auVar49._0_4_);
            auVar81._4_4_ = (float)(auVar58._4_4_ ^ auVar49._4_4_);
            auVar81._8_4_ = (float)(auVar58._8_4_ ^ auVar49._8_4_);
            auVar81._12_4_ = (float)(auVar58._12_4_ ^ auVar49._12_4_);
            auVar81._16_4_ = (float)((uint)fVar68 ^ auVar49._16_4_);
            auVar81._20_4_ = (float)((uint)fVar69 ^ auVar49._20_4_);
            auVar81._24_4_ = (float)((uint)fVar70 ^ auVar49._24_4_);
            auVar81._28_4_ = (float)(auVar58._28_4_ ^ auVar49._28_4_);
            auVar49 = auVar95._0_32_;
            uVar9 = vcmpps_avx512vl(auVar57,auVar49,5);
            uVar6 = vcmpps_avx512vl(auVar81,auVar49,5);
            uVar7 = vcmpps_avx512vl(ZEXT1632(auVar34),auVar49,4);
            auVar82._0_4_ = auVar81._0_4_ + 0.0;
            auVar82._4_4_ = auVar81._4_4_ + 0.0;
            auVar82._8_4_ = auVar81._8_4_ + 0.0;
            auVar82._12_4_ = auVar81._12_4_ + 0.0;
            auVar82._16_4_ = auVar81._16_4_ + 0.0;
            auVar82._20_4_ = auVar81._20_4_ + 0.0;
            auVar82._24_4_ = auVar81._24_4_ + 0.0;
            auVar82._28_4_ = auVar81._28_4_ + 0.0;
            uVar8 = vcmpps_avx512vl(auVar82,local_1100,2);
            local_10df = (byte)uVar9 & (byte)uVar6 & (byte)uVar7 & (byte)uVar8;
            if (local_10df != 0) {
              auVar15._4_4_ = auVar30._4_4_ * auVar52._4_4_;
              auVar15._0_4_ = auVar30._0_4_ * auVar52._0_4_;
              auVar15._8_4_ = auVar30._8_4_ * auVar52._8_4_;
              auVar15._12_4_ = auVar30._12_4_ * auVar52._12_4_;
              auVar15._16_4_ = auVar52._16_4_ * 0.0;
              auVar15._20_4_ = auVar52._20_4_ * 0.0;
              auVar15._24_4_ = auVar52._24_4_ * 0.0;
              auVar15._28_4_ = auVar52._28_4_;
              auVar34 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar33),auVar15);
              auVar34 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar31),ZEXT1632(auVar34));
              local_1120._0_4_ = (float)(auVar58._0_4_ ^ auVar34._0_4_);
              local_1120._4_4_ = (float)(auVar58._4_4_ ^ auVar34._4_4_);
              local_1120._8_4_ = (float)(auVar58._8_4_ ^ auVar34._8_4_);
              local_1120._12_4_ = (float)(auVar58._12_4_ ^ auVar34._12_4_);
              local_1120._16_4_ = fVar68;
              local_1120._20_4_ = fVar69;
              local_1120._24_4_ = fVar70;
              local_1120._28_4_ = auVar58._28_4_;
              uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar11._4_4_ = uVar73;
              auVar11._0_4_ = uVar73;
              auVar11._8_4_ = uVar73;
              auVar11._12_4_ = uVar73;
              auVar11._16_4_ = uVar73;
              auVar11._20_4_ = uVar73;
              auVar11._24_4_ = uVar73;
              auVar11._28_4_ = uVar73;
              auVar49 = vmulps_avx512vl(local_1100,auVar11);
              uVar9 = vcmpps_avx512vl(auVar49,local_1120,1);
              fVar62 = (ray->super_RayK<1>).tfar;
              auVar12._4_4_ = fVar62;
              auVar12._0_4_ = fVar62;
              auVar12._8_4_ = fVar62;
              auVar12._12_4_ = fVar62;
              auVar12._16_4_ = fVar62;
              auVar12._20_4_ = fVar62;
              auVar12._24_4_ = fVar62;
              auVar12._28_4_ = fVar62;
              auVar49 = vmulps_avx512vl(local_1100,auVar12);
              uVar6 = vcmpps_avx512vl(local_1120,auVar49,2);
              local_10df = (byte)uVar9 & (byte)uVar6 & local_10df;
              if (local_10df != 0) {
                auVar49 = vsubps_avx(local_1100,auVar81);
                local_1160 = vblendps_avx(auVar57,auVar49,0xf0);
                auVar49 = vsubps_avx(local_1100,auVar57);
                local_1140 = vblendps_avx(auVar81,auVar49,0xf0);
                auVar49 = auVar96._0_32_;
                local_1060 = vmulps_avx512vl(ZEXT1632(auVar31),auVar49);
                local_1040 = vmulps_avx512vl(ZEXT1632(auVar33),auVar49);
                local_1020 = vmulps_avx512vl(ZEXT1632(auVar30),auVar49);
                local_1238 = context->scene;
                uVar26 = (ulong)local_10df;
                auVar49 = vrcp14ps_avx512vl(local_1100);
                auVar60 = vfnmadd213ps_avx512vl(local_1100,auVar49,auVar97._0_32_);
                auVar34 = vfmadd132ps_fma(auVar60,auVar49,auVar49);
                fVar62 = auVar34._0_4_;
                fVar65 = auVar34._4_4_;
                local_1080._4_4_ = fVar65 * local_1120._4_4_;
                local_1080._0_4_ = fVar62 * local_1120._0_4_;
                fVar66 = auVar34._8_4_;
                local_1080._8_4_ = fVar66 * local_1120._8_4_;
                fVar67 = auVar34._12_4_;
                local_1080._12_4_ = fVar67 * local_1120._12_4_;
                local_1080._16_4_ = fVar68 * 0.0;
                local_1080._20_4_ = fVar69 * 0.0;
                local_1080._24_4_ = fVar70 * 0.0;
                local_1080._28_4_ = auVar81._28_4_;
                auVar64 = ZEXT3264(local_1080);
                iStack_10a4 = auVar49._28_4_;
                local_10c0[0] = local_1160._0_4_ * fVar62;
                local_10c0[1] = local_1160._4_4_ * fVar65;
                local_10c0[2] = local_1160._8_4_ * fVar66;
                local_10c0[3] = local_1160._12_4_ * fVar67;
                fStack_10b0 = local_1160._16_4_ * 0.0;
                fStack_10ac = local_1160._20_4_ * 0.0;
                fStack_10a8 = local_1160._24_4_ * 0.0;
                fVar62 = local_1140._0_4_ * fVar62;
                fVar65 = local_1140._4_4_ * fVar65;
                local_10a0._4_4_ = fVar65;
                local_10a0._0_4_ = fVar62;
                fVar66 = local_1140._8_4_ * fVar66;
                local_10a0._8_4_ = fVar66;
                fVar67 = local_1140._12_4_ * fVar67;
                local_10a0._12_4_ = fVar67;
                fVar68 = local_1140._16_4_ * 0.0;
                local_10a0._16_4_ = fVar68;
                fVar69 = local_1140._20_4_ * 0.0;
                local_10a0._20_4_ = fVar69;
                fVar70 = local_1140._24_4_ * 0.0;
                local_10a0._24_4_ = fVar70;
                local_10a0._28_4_ = iStack_10a4;
                auVar49 = vblendmps_avx512vl(auVar98._0_32_,local_1080);
                auVar61._0_4_ =
                     (uint)(local_10df & 1) * auVar49._0_4_ |
                     (uint)!(bool)(local_10df & 1) * (int)fVar62;
                bVar4 = (bool)(local_10df >> 1 & 1);
                auVar61._4_4_ = (uint)bVar4 * auVar49._4_4_ | (uint)!bVar4 * (int)fVar65;
                bVar4 = (bool)(local_10df >> 2 & 1);
                auVar61._8_4_ = (uint)bVar4 * auVar49._8_4_ | (uint)!bVar4 * (int)fVar66;
                bVar4 = (bool)(local_10df >> 3 & 1);
                auVar61._12_4_ = (uint)bVar4 * auVar49._12_4_ | (uint)!bVar4 * (int)fVar67;
                bVar4 = (bool)(local_10df >> 4 & 1);
                auVar61._16_4_ = (uint)bVar4 * auVar49._16_4_ | (uint)!bVar4 * (int)fVar68;
                bVar4 = (bool)(local_10df >> 5 & 1);
                auVar61._20_4_ = (uint)bVar4 * auVar49._20_4_ | (uint)!bVar4 * (int)fVar69;
                bVar4 = (bool)(local_10df >> 6 & 1);
                auVar61._24_4_ = (uint)bVar4 * auVar49._24_4_ | (uint)!bVar4 * (int)fVar70;
                auVar61._28_4_ =
                     (uint)(local_10df >> 7) * auVar49._28_4_ |
                     (uint)!(bool)(local_10df >> 7) * iStack_10a4;
                auVar49 = vshufps_avx(auVar61,auVar61,0xb1);
                auVar49 = vminps_avx(auVar61,auVar49);
                auVar60 = vshufpd_avx(auVar49,auVar49,5);
                auVar49 = vminps_avx(auVar49,auVar60);
                auVar60 = vpermpd_avx2(auVar49,0x4e);
                auVar49 = vminps_avx(auVar49,auVar60);
                uVar9 = vcmpps_avx512vl(auVar61,auVar49,0);
                bVar17 = (byte)uVar9 & local_10df;
                if (bVar17 == 0) {
                  bVar17 = local_10df;
                }
                local_1260 = 0;
                for (uVar21 = (ulong)bVar17; (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  local_1260 = local_1260 + 1;
                }
                do {
                  auVar34 = auVar95._0_16_;
                  local_11e8 = *(uint *)((long)&local_fc0 + local_1260 * 4);
                  local_1270 = (ulong)local_11e8;
                  local_1268 = (local_1238->geometries).items[local_11e8].ptr;
                  auVar49 = auVar61;
                  if ((local_1268->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar26 = (ulong)(byte)(~(byte)(1 << ((uint)local_1260 & 0x1f)) & (byte)uVar26);
                    bVar4 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (local_1268->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar4 = false;
                  }
                  else {
                    local_1278 = context->args;
                    local_fe0 = auVar64._0_32_;
                    local_11d0 = auVar92._0_16_;
                    local_11c0 = auVar91._0_16_;
                    local_11b0 = auVar90._0_16_;
                    local_11a0 = auVar89._0_16_;
                    local_1190 = auVar88._0_16_;
                    local_1180 = auVar87._0_16_;
                    local_1170 = auVar86._0_16_;
                    local_1230.context = context->user;
                    local_1200 = *(float *)(local_1060 + local_1260 * 4);
                    local_11fc = *(undefined4 *)(local_1040 + local_1260 * 4);
                    local_11f8 = *(undefined4 *)(local_1020 + local_1260 * 4);
                    local_11f4 = local_10c0[local_1260];
                    local_11f0 = *(undefined4 *)(local_10a0 + local_1260 * 4);
                    local_11ec = *(undefined4 *)((long)&local_1000 + local_1260 * 4);
                    local_11e4 = (local_1230.context)->instID[0];
                    local_11e0 = (local_1230.context)->instPrimID[0];
                    fVar68 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1080 + local_1260 * 4);
                    local_127c = -1;
                    local_1230.valid = &local_127c;
                    local_1230.geometryUserPtr = local_1268->userPtr;
                    local_1230.ray = (RTCRayN *)ray;
                    local_1230.hit = (RTCHitN *)&local_1200;
                    local_1230.N = 1;
                    if ((local_1268->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_1268->intersectionFilterN)(&local_1230), *local_1230.valid != 0)) {
                      if (local_1278->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_1278->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_1268->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_1278->filter)(&local_1230);
                        }
                        if (*local_1230.valid == 0) goto LAB_01f4bd66;
                      }
                      (((Vec3f *)((long)local_1230.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1230.hit;
                      (((Vec3f *)((long)local_1230.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1230.hit + 4);
                      (((Vec3f *)((long)local_1230.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1230.hit + 8);
                      *(float *)((long)local_1230.ray + 0x3c) = *(float *)(local_1230.hit + 0xc);
                      fVar68 = *(float *)(local_1230.hit + 0x10);
                      *(float *)((long)local_1230.ray + 0x40) = fVar68;
                      *(float *)((long)local_1230.ray + 0x44) = *(float *)(local_1230.hit + 0x14);
                      *(float *)((long)local_1230.ray + 0x48) = *(float *)(local_1230.hit + 0x18);
                      *(float *)((long)local_1230.ray + 0x4c) = *(float *)(local_1230.hit + 0x1c);
                      *(float *)((long)local_1230.ray + 0x50) = *(float *)(local_1230.hit + 0x20);
                    }
                    else {
LAB_01f4bd66:
                      (ray->super_RayK<1>).tfar = fVar68;
                    }
                    auVar64 = ZEXT3264(local_fe0);
                    fVar69 = (ray->super_RayK<1>).tfar;
                    auVar13._4_4_ = fVar69;
                    auVar13._0_4_ = fVar69;
                    auVar13._8_4_ = fVar69;
                    auVar13._12_4_ = fVar69;
                    auVar13._16_4_ = fVar69;
                    auVar13._20_4_ = fVar69;
                    auVar13._24_4_ = fVar69;
                    auVar13._28_4_ = fVar69;
                    uVar21 = vcmpps_avx512vl(local_fe0,auVar13,2);
                    uVar26 = (byte)(~(byte)(1 << ((uint)local_1260 & 0x1f)) & (byte)uVar26) & uVar21
                    ;
                    bVar4 = true;
                    auVar86 = ZEXT1664(local_1170);
                    auVar87 = ZEXT1664(local_1180);
                    auVar88 = ZEXT1664(local_1190);
                    auVar89 = ZEXT1664(local_11a0);
                    auVar90 = ZEXT1664(local_11b0);
                    auVar91 = ZEXT1664(local_11c0);
                    auVar92 = ZEXT1664(local_11d0);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar93 = ZEXT3264(auVar49);
                    auVar49 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
                    auVar94 = ZEXT3264(auVar49);
                    auVar34 = vxorps_avx512vl(auVar34,auVar34);
                    auVar95 = ZEXT1664(auVar34);
                    auVar96 = ZEXT3264(_DAT_02060940);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar97 = ZEXT3264(auVar49);
                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar98 = ZEXT3264(auVar49);
                    auVar49 = ZEXT432((uint)fVar68);
                  }
                  if (!bVar4) {
                    fVar68 = local_10c0[local_1260];
                    fVar69 = *(float *)(local_10a0 + local_1260 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1080 + local_1260 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1060 + local_1260 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_1040 + local_1260 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_1020 + local_1260 * 4);
                    ray->u = fVar68;
                    ray->v = fVar69;
                    ray->primID = *(uint *)((long)&local_1000 + local_1260 * 4);
                    ray->geomID = (uint)local_1270;
                    pRVar3 = context->user;
                    ray->instID[0] = pRVar3->instID[0];
                    ray->instPrimID[0] = pRVar3->instPrimID[0];
                    break;
                  }
                  bVar17 = (byte)uVar26;
                  if (bVar17 == 0) break;
                  auVar60 = vblendmps_avx512vl(auVar98._0_32_,auVar64._0_32_);
                  auVar61._0_4_ =
                       (uint)(bVar17 & 1) * auVar60._0_4_ |
                       (uint)!(bool)(bVar17 & 1) * auVar49._0_4_;
                  bVar4 = (bool)((byte)(uVar26 >> 1) & 1);
                  auVar61._4_4_ = (uint)bVar4 * auVar60._4_4_ | (uint)!bVar4 * auVar49._4_4_;
                  bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
                  auVar61._8_4_ = (uint)bVar4 * auVar60._8_4_ | (uint)!bVar4 * auVar49._8_4_;
                  bVar4 = (bool)((byte)(uVar26 >> 3) & 1);
                  auVar61._12_4_ = (uint)bVar4 * auVar60._12_4_ | (uint)!bVar4 * auVar49._12_4_;
                  bVar4 = (bool)((byte)(uVar26 >> 4) & 1);
                  auVar61._16_4_ = (uint)bVar4 * auVar60._16_4_ | (uint)!bVar4 * auVar49._16_4_;
                  bVar4 = (bool)((byte)(uVar26 >> 5) & 1);
                  auVar61._20_4_ = (uint)bVar4 * auVar60._20_4_ | (uint)!bVar4 * auVar49._20_4_;
                  bVar4 = (bool)((byte)(uVar26 >> 6) & 1);
                  auVar61._24_4_ = (uint)bVar4 * auVar60._24_4_ | (uint)!bVar4 * auVar49._24_4_;
                  bVar4 = SUB81(uVar26 >> 7,0);
                  auVar61._28_4_ = (uint)bVar4 * auVar60._28_4_ | (uint)!bVar4 * auVar49._28_4_;
                  auVar49 = vshufps_avx(auVar61,auVar61,0xb1);
                  auVar49 = vminps_avx(auVar61,auVar49);
                  auVar60 = vshufpd_avx(auVar49,auVar49,5);
                  auVar49 = vminps_avx(auVar49,auVar60);
                  auVar60 = vpermpd_avx2(auVar49,0x4e);
                  auVar49 = vminps_avx(auVar49,auVar60);
                  uVar9 = vcmpps_avx512vl(auVar61,auVar49,0);
                  bVar17 = (byte)uVar9 & bVar17;
                  uVar22 = (uint)uVar26;
                  if (bVar17 != 0) {
                    uVar22 = (uint)bVar17;
                  }
                  uVar10 = 0;
                  for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                    uVar10 = uVar10 + 1;
                  }
                  local_1260 = (ulong)uVar10;
                } while( true );
              }
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 != uVar27 - 8);
        }
        fVar68 = (ray->super_RayK<1>).tfar;
        auVar64 = ZEXT1664(CONCAT412(fVar68,CONCAT48(fVar68,CONCAT44(fVar68,fVar68))));
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }